

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void highbd_dr_prediction_z3_4x4_avx2
               (uint16_t *dst,ptrdiff_t stride,uint16_t *left,int upsample_left,int dy,int bd)

{
  ushort uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  ushort uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  undefined8 uVar44;
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  int iVar57;
  uint uVar58;
  int iVar59;
  undefined1 (*pauVar60) [16];
  undefined1 (*pauVar61) [16];
  long lVar62;
  uint in_ECX;
  long in_RDX;
  long in_RSI;
  longlong *in_RDI;
  uint in_R8D;
  int in_R9D;
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [16];
  __m128i d [4];
  __m128i dstvec [4];
  int i;
  int base;
  __m128i res1;
  __m256i shift;
  __m256i res;
  __m256i b;
  int r;
  int x;
  __m128i a1_128;
  __m128i a0_128;
  __m128i mask128;
  __m128i base_inc128;
  __m128i max_base_x128;
  __m128i a_mbase_x;
  __m256i c3f;
  __m256i diff;
  __m256i a16;
  __m256i a32;
  __m256i a1;
  __m256i a0;
  int max_base_x;
  int frac_bits;
  int i_1;
  int base_1;
  __m128i res1_1;
  __m256i shift_1;
  __m256i res_1;
  __m256i b_1;
  int r_1;
  int x_1;
  __m128i mask128_1;
  __m128i base_inc128_1;
  __m128i max_base_x128_1;
  __m128i a_mbase_x_1;
  __m256i diff_1;
  __m256i a16_1;
  __m256i a32_1;
  __m256i a1_1;
  __m256i a0_1;
  int max_base_x_1;
  int frac_bits_1;
  longlong local_1100 [2];
  longlong local_10f0 [2];
  longlong local_10e0 [2];
  longlong local_10d0 [2];
  longlong local_10c0 [4];
  longlong local_10a0 [2];
  longlong local_1090 [5];
  long local_1068;
  longlong *local_1060;
  int local_1058;
  int local_1054;
  undefined8 local_1050;
  undefined8 uStack_1048;
  undefined1 local_1040 [32];
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  int local_fc8;
  uint local_fc4;
  undefined1 local_fc0 [16];
  undefined1 local_fb0 [16];
  undefined1 local_fa0 [16];
  undefined8 local_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  longlong local_f70;
  longlong lStack_f68;
  undefined1 local_f60 [16];
  undefined1 auStack_f50 [16];
  undefined1 local_f40 [32];
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined1 local_f00 [32];
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined1 auStack_ed0 [16];
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined1 auStack_eb0 [16];
  uint local_e88;
  int local_e84;
  byte local_e7c;
  longlong *local_e70;
  undefined4 local_e64;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  ushort local_dca;
  undefined2 local_dc8;
  ushort local_dc6;
  undefined2 local_dc4;
  undefined2 local_dc2;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  ushort local_d64;
  ushort local_d62;
  uint8_t local_d60 [8];
  uint8_t auStack_d58 [8];
  undefined8 local_d50;
  undefined8 uStack_d48;
  undefined1 local_d40 [16];
  undefined1 auStack_d30 [16];
  undefined2 local_d20;
  undefined2 local_d1e;
  undefined2 local_d1c;
  undefined2 local_d1a;
  undefined2 local_d18;
  undefined2 local_d16;
  undefined2 local_d14;
  undefined2 local_d12;
  undefined2 local_d10;
  undefined2 local_d0e;
  undefined2 local_d0c;
  undefined2 local_d0a;
  undefined2 local_d08;
  undefined2 local_d06;
  undefined2 local_d04;
  undefined2 local_d02;
  undefined1 local_d00 [32];
  undefined2 local_ce0;
  undefined2 local_cde;
  undefined2 local_cdc;
  undefined2 local_cda;
  undefined2 local_cd8;
  undefined2 local_cd6;
  undefined2 local_cd4;
  undefined2 local_cd2;
  undefined2 local_cd0;
  undefined2 local_cce;
  undefined2 local_ccc;
  undefined2 local_cca;
  undefined2 local_cc8;
  undefined2 local_cc6;
  undefined2 local_cc4;
  undefined2 local_cc2;
  undefined1 local_cc0 [16];
  undefined1 auStack_cb0 [16];
  ushort local_ca0;
  ushort local_c9e;
  ushort local_c9c;
  ushort local_c9a;
  ushort local_c98;
  ushort local_c96;
  ushort local_c94;
  ushort local_c92;
  ushort local_c90;
  ushort local_c8e;
  ushort local_c8c;
  ushort local_c8a;
  ushort local_c88;
  ushort local_c86;
  ushort local_c84;
  ushort local_c82;
  undefined1 local_c80 [32];
  undefined2 local_c60;
  undefined2 local_c5e;
  undefined2 local_c5c;
  undefined2 local_c5a;
  undefined2 local_c58;
  undefined2 local_c56;
  undefined2 local_c54;
  undefined2 local_c52;
  undefined2 local_c50;
  undefined2 local_c4e;
  undefined2 local_c4c;
  undefined2 local_c4a;
  undefined2 local_c48;
  undefined2 local_c46;
  undefined2 local_c44;
  undefined2 local_c42;
  undefined1 local_c40 [32];
  ushort local_c20;
  ushort local_c1e;
  ushort local_c1c;
  ushort local_c1a;
  ushort local_c18;
  ushort local_c16;
  ushort local_c14;
  ushort local_c12;
  ushort local_c10;
  ushort local_c0e;
  ushort local_c0c;
  ushort local_c0a;
  ushort local_c08;
  ushort local_c06;
  ushort local_c04;
  ushort local_c02;
  undefined1 local_c00 [16];
  ushort local_bf0;
  ushort local_bee;
  ushort local_bec;
  ushort local_bea;
  ushort local_be8;
  ushort local_be6;
  ushort local_be4;
  ushort local_be2;
  undefined1 local_be0 [16];
  ushort local_bd0;
  ushort local_bce;
  ushort local_bcc;
  ushort local_bca;
  ushort local_bc8;
  ushort local_bc6;
  ushort local_bc4;
  ushort local_bc2;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined1 local_b80 [16];
  undefined1 auStack_b70 [16];
  undefined1 local_b60 [16];
  undefined1 auStack_b50 [16];
  undefined1 local_b40 [16];
  undefined1 auStack_b30 [16];
  undefined1 local_b20 [32];
  int local_af8;
  uint local_af4;
  undefined1 local_af0 [16];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  int local_a68;
  uint local_a64;
  undefined1 local_a60 [16];
  undefined8 local_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  longlong local_a30;
  longlong lStack_a28;
  undefined1 local_a20 [32];
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [24];
  undefined8 uStack_9a8;
  undefined1 local_9a0 [32];
  uint local_968;
  int local_964;
  longlong *local_950;
  undefined4 local_944;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined1 local_900 [16];
  ushort local_8f0;
  ushort local_8ee;
  ushort local_8ec;
  ushort local_8ea;
  ushort local_8e8;
  ushort local_8e6;
  ushort local_8e4;
  ushort local_8e2;
  undefined1 local_8e0 [16];
  undefined1 auStack_8d0 [16];
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined1 local_8a0 [16];
  undefined1 auStack_890 [16];
  undefined1 local_880 [32];
  undefined1 (*local_7d0) [16];
  undefined1 (*local_7c8) [16];
  undefined1 (*local_7c0) [16];
  undefined1 (*local_7b8) [16];
  ushort local_7b0;
  ushort local_7ae;
  ushort local_7ac;
  ushort local_7aa;
  ushort local_7a8;
  ushort local_7a6;
  ushort local_7a4;
  ushort local_7a2;
  undefined1 local_7a0 [16];
  ushort local_790;
  ushort local_78e;
  ushort local_78c;
  ushort local_78a;
  ushort local_788;
  ushort local_786;
  ushort local_784;
  ushort local_782;
  ushort local_780;
  ushort local_77e;
  ushort local_77c;
  ushort local_77a;
  ushort local_778;
  ushort local_776;
  ushort local_774;
  ushort local_772;
  undefined1 local_770 [16];
  ushort local_754;
  ushort local_752;
  ushort local_750;
  ushort local_74e;
  ushort local_74c;
  ushort local_74a;
  ushort local_748;
  ushort local_746;
  undefined4 local_744;
  undefined1 local_740 [32];
  undefined4 local_704;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined4 local_6c4;
  undefined1 local_6c0 [32];
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined4 local_644;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  longlong local_5a0;
  longlong lStack_598;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  longlong local_570;
  longlong lStack_568;
  undefined4 local_558;
  uint local_554;
  undefined4 local_550;
  uint local_54c;
  undefined4 local_548;
  uint local_544;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined1 local_4e0 [16];
  undefined1 auStack_4d0 [16];
  undefined4 local_4c0;
  undefined4 local_4bc;
  undefined4 local_4b8;
  undefined4 local_4b4;
  undefined4 local_4b0;
  undefined4 local_4ac;
  undefined4 local_4a8;
  undefined4 local_4a4;
  undefined1 local_4a0 [16];
  undefined1 auStack_490 [16];
  uint local_480;
  uint local_47c;
  uint local_478;
  uint local_474;
  uint local_470;
  uint local_46c;
  uint local_468;
  uint local_464;
  undefined1 local_460 [32];
  undefined4 local_440;
  undefined4 local_43c;
  undefined4 local_438;
  undefined4 local_434;
  undefined4 local_430;
  undefined4 local_42c;
  undefined4 local_428;
  undefined4 local_424;
  undefined1 local_420 [16];
  undefined1 auStack_410 [16];
  uint local_400;
  uint local_3fc;
  uint local_3f8;
  uint local_3f4;
  uint local_3f0;
  uint local_3ec;
  uint local_3e8;
  uint local_3e4;
  undefined1 local_3e0 [32];
  undefined4 local_3c0;
  undefined4 local_3bc;
  undefined4 local_3b8;
  undefined4 local_3b4;
  undefined4 local_3b0;
  undefined4 local_3ac;
  undefined4 local_3a8;
  undefined4 local_3a4;
  undefined1 local_3a0 [16];
  undefined1 auStack_390 [16];
  undefined4 local_364;
  undefined4 local_360;
  undefined4 local_35c;
  undefined4 local_358;
  undefined4 local_354;
  undefined4 local_350;
  undefined4 local_34c;
  undefined4 local_348;
  int local_344;
  int local_340;
  int local_33c;
  uint local_338;
  int local_334;
  int local_330;
  int local_32c;
  uint local_328;
  undefined4 local_324;
  undefined1 local_320 [32];
  undefined4 local_2e4;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined4 local_2a4;
  undefined1 local_2a0 [32];
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined4 local_224;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined1 local_90 [16];
  uint local_80;
  int local_7c;
  int local_78;
  int local_74;
  undefined1 local_70 [16];
  uint local_60;
  int local_5c;
  int local_58;
  int local_54;
  undefined1 local_50 [16];
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  auVar56._8_8_ = auStack_b70._8_8_;
  auVar56._0_8_ = auStack_b70._0_8_;
  auVar55._8_8_ = local_b80._8_8_;
  auVar55._0_8_ = local_b80._0_8_;
  auVar66._24_8_ = auStack_890._8_8_;
  auVar66._16_8_ = auStack_890._0_8_;
  auVar66._8_8_ = local_8a0._8_8_;
  auVar66._0_8_ = local_8a0._0_8_;
  auVar67._24_8_ = auStack_8d0._8_8_;
  auVar67._16_8_ = auStack_8d0._0_8_;
  auVar67._8_8_ = local_8e0._8_8_;
  auVar67._0_8_ = local_8e0._0_8_;
  auVar64._24_8_ = auStack_b30._8_8_;
  auVar64._16_8_ = auStack_b30._0_8_;
  auVar64._8_8_ = local_b40._8_8_;
  auVar64._0_8_ = local_b40._0_8_;
  auVar65._24_8_ = auStack_b50._8_8_;
  auVar65._16_8_ = auStack_b50._0_8_;
  auVar65._8_8_ = local_b60._8_8_;
  auVar65._0_8_ = local_b60._0_8_;
  auVar63._24_8_ = auStack_f50._8_8_;
  auVar63._16_8_ = auStack_f50._0_8_;
  auVar63._8_8_ = local_f60._8_8_;
  auVar63._0_8_ = local_f60._0_8_;
  local_e7c = (byte)in_ECX;
  if (in_R9D < 0xc) {
    local_e64 = 4;
    iVar57 = 6 - in_ECX;
    uVar58 = 7 << (local_e7c & 0x1f);
    local_dc2 = 0x10;
    local_d02 = 0x10;
    local_d04 = 0x10;
    local_d06 = 0x10;
    local_d08 = 0x10;
    local_d0a = 0x10;
    local_d0c = 0x10;
    local_d0e = 0x10;
    local_d10 = 0x10;
    local_d12 = 0x10;
    local_d14 = 0x10;
    local_d16 = 0x10;
    local_d18 = 0x10;
    local_d1a = 0x10;
    local_d1c = 0x10;
    local_d1e = 0x10;
    local_d20 = 0x10;
    auVar63._0_16_ = vpinsrw_avx(ZEXT216(0x10),0x10,1);
    auVar63._0_16_ = vpinsrw_avx(auVar63._0_16_,0x10,2);
    auVar63._0_16_ = vpinsrw_avx(auVar63._0_16_,0x10,3);
    auVar63._0_16_ = vpinsrw_avx(auVar63._0_16_,0x10,4);
    auVar63._0_16_ = vpinsrw_avx(auVar63._0_16_,0x10,5);
    auVar63._0_16_ = vpinsrw_avx(auVar63._0_16_,0x10,6);
    auVar4 = vpinsrw_avx(auVar63._0_16_,0x10,7);
    auVar63._0_16_ = vpinsrw_avx(ZEXT216(0x10),0x10,1);
    auVar63._0_16_ = vpinsrw_avx(auVar63._0_16_,0x10,2);
    auVar63._0_16_ = vpinsrw_avx(auVar63._0_16_,0x10,3);
    auVar63._0_16_ = vpinsrw_avx(auVar63._0_16_,0x10,4);
    auVar63._0_16_ = vpinsrw_avx(auVar63._0_16_,0x10,5);
    auVar63._0_16_ = vpinsrw_avx(auVar63._0_16_,0x10,6);
    auVar5 = vpinsrw_avx(auVar63._0_16_,0x10,7);
    local_d40._0_8_ = auVar4._0_8_;
    local_d40._8_8_ = auVar4._8_8_;
    auStack_d30._0_8_ = auVar5._0_8_;
    auStack_d30._8_8_ = auVar5._8_8_;
    local_f20 = local_d40._0_8_;
    uStack_f18 = local_d40._8_8_;
    uStack_f10 = auStack_d30._0_8_;
    uStack_f08 = auStack_d30._8_8_;
    uVar1 = *(ushort *)(in_RDX + (long)(int)uVar58 * 2);
    auVar63._0_16_ = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
    auVar63._0_16_ = vpinsrw_avx(auVar63._0_16_,(uint)uVar1,2);
    auVar63._0_16_ = vpinsrw_avx(auVar63._0_16_,(uint)uVar1,3);
    auVar63._0_16_ = vpinsrw_avx(auVar63._0_16_,(uint)uVar1,4);
    auVar63._0_16_ = vpinsrw_avx(auVar63._0_16_,(uint)uVar1,5);
    auVar63._0_16_ = vpinsrw_avx(auVar63._0_16_,(uint)uVar1,6);
    auVar6 = vpinsrw_avx(auVar63._0_16_,(uint)uVar1,7);
    local_c00._0_8_ = auVar6._0_8_;
    local_c00._8_8_ = auVar6._8_8_;
    local_f70 = local_c00._0_8_;
    lStack_f68 = local_c00._8_8_;
    local_e88._0_2_ = (ushort)uVar58;
    local_d64 = (ushort)local_e88;
    local_bc2 = (ushort)local_e88;
    local_bc4 = (ushort)local_e88;
    local_bc6 = (ushort)local_e88;
    local_bc8 = (ushort)local_e88;
    local_bca = (ushort)local_e88;
    local_bcc = (ushort)local_e88;
    local_bce = (ushort)local_e88;
    local_bd0 = (ushort)local_e88;
    auVar63._0_16_ = vpinsrw_avx(ZEXT216((ushort)local_e88),uVar58 & 0xffff,1);
    auVar63._0_16_ = vpinsrw_avx(auVar63._0_16_,uVar58 & 0xffff,2);
    auVar63._0_16_ = vpinsrw_avx(auVar63._0_16_,uVar58 & 0xffff,3);
    auVar63._0_16_ = vpinsrw_avx(auVar63._0_16_,uVar58 & 0xffff,4);
    auVar63._0_16_ = vpinsrw_avx(auVar63._0_16_,uVar58 & 0xffff,5);
    auVar63._0_16_ = vpinsrw_avx(auVar63._0_16_,uVar58 & 0xffff,6);
    auVar7 = vpinsrw_avx(auVar63._0_16_,uVar58 & 0xffff,7);
    local_be0._0_8_ = auVar7._0_8_;
    local_be0._8_8_ = auVar7._8_8_;
    local_f80 = local_be0._0_8_;
    uStack_f78 = local_be0._8_8_;
    local_dc4 = 0x3f;
    local_cc2 = 0x3f;
    local_cc4 = 0x3f;
    local_cc6 = 0x3f;
    local_cc8 = 0x3f;
    local_cca = 0x3f;
    local_ccc = 0x3f;
    local_cce = 0x3f;
    local_cd0 = 0x3f;
    local_cd2 = 0x3f;
    local_cd4 = 0x3f;
    local_cd6 = 0x3f;
    local_cd8 = 0x3f;
    local_cda = 0x3f;
    local_cdc = 0x3f;
    local_cde = 0x3f;
    local_ce0 = 0x3f;
    auVar63._0_16_ = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
    auVar63._0_16_ = vpinsrw_avx(auVar63._0_16_,0x3f,2);
    auVar63._0_16_ = vpinsrw_avx(auVar63._0_16_,0x3f,3);
    auVar63._0_16_ = vpinsrw_avx(auVar63._0_16_,0x3f,4);
    auVar63._0_16_ = vpinsrw_avx(auVar63._0_16_,0x3f,5);
    auVar63._0_16_ = vpinsrw_avx(auVar63._0_16_,0x3f,6);
    auVar63._16_16_ = vpinsrw_avx(auVar63._0_16_,0x3f,7);
    auVar63._0_16_ = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
    auVar63._0_16_ = vpinsrw_avx(auVar63._0_16_,0x3f,2);
    auVar63._0_16_ = vpinsrw_avx(auVar63._0_16_,0x3f,3);
    auVar63._0_16_ = vpinsrw_avx(auVar63._0_16_,0x3f,4);
    auVar63._0_16_ = vpinsrw_avx(auVar63._0_16_,0x3f,5);
    auVar63._0_16_ = vpinsrw_avx(auVar63._0_16_,0x3f,6);
    auVar63._0_16_ = vpinsrw_avx(auVar63._0_16_,0x3f,7);
    auVar63._0_16_ = ZEXT116(0) * auVar63._16_16_ + ZEXT116(1) * auVar63._0_16_;
    auVar63._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar63._16_16_;
    local_d00._16_8_ = auVar63._16_8_;
    local_d00._24_8_ = auVar63._24_8_;
    local_fc4 = in_R8D;
    for (local_fc8 = 0; local_e88 = uVar58, local_e84 = iVar57, local_e70 = local_10c0,
        local_d62 = uVar1, auVar10 = auVar63, local_bf0 = uVar1, local_bee = uVar1,
        local_bec = uVar1, local_bea = uVar1, local_be8 = uVar1, local_be6 = uVar1,
        local_be4 = uVar1, local_be2 = uVar1, auVar68 = local_900, auVar2 = local_4e0,
        auVar3 = auStack_4d0, local_fc8 < 4; local_fc8 = local_fc8 + 1) {
      iVar59 = (int)local_fc4 >> ((byte)iVar57 & 0x1f);
      local_1054 = iVar59;
      if ((int)uVar58 <= iVar59) {
        for (local_1058 = local_fc8; local_1058 < 4; local_1058 = local_1058 + 1) {
          local_10c0[(long)local_1058 * 2] = local_c00._0_8_;
          local_10c0[(long)local_1058 * 2 + 1] = local_c00._8_8_;
        }
        break;
      }
      pauVar60 = (undefined1 (*) [16])(in_RDX + (long)iVar59 * 2);
      local_fb0 = *pauVar60;
      pauVar61 = (undefined1 (*) [16])(in_RDX + (long)iVar59 * 2 + 2);
      local_fc0 = *pauVar61;
      uVar12 = (ushort)iVar59;
      if (in_ECX == 0) {
        local_774 = uVar12 + 1;
        local_776 = uVar12 + 2;
        local_778 = uVar12 + 3;
        local_77a = uVar12 + 4;
        local_77c = uVar12 + 5;
        local_77e = uVar12 + 6;
        local_780 = uVar12 + 7;
        auVar65._0_16_ = vpinsrw_avx(ZEXT216(uVar12),(uint)local_774,1);
        auVar65._0_16_ = vpinsrw_avx(auVar65._0_16_,(uint)local_776,2);
        auVar65._0_16_ = vpinsrw_avx(auVar65._0_16_,(uint)local_778,3);
        auVar65._0_16_ = vpinsrw_avx(auVar65._0_16_,(uint)local_77a,4);
        auVar65._0_16_ = vpinsrw_avx(auVar65._0_16_,(uint)local_77c,5);
        auVar65._0_16_ = vpinsrw_avx(auVar65._0_16_,(uint)local_77e,6);
        local_770 = vpinsrw_avx(auVar65._0_16_,(uint)local_780,7);
        local_f90 = local_770._0_8_;
        uStack_f88 = local_770._8_8_;
        local_dca = (ushort)local_fc4;
        local_c02 = (ushort)local_fc4;
        local_c04 = (ushort)local_fc4;
        local_c06 = (ushort)local_fc4;
        local_c08 = (ushort)local_fc4;
        local_c0a = (ushort)local_fc4;
        local_c0c = (ushort)local_fc4;
        local_c0e = (ushort)local_fc4;
        local_c10 = (ushort)local_fc4;
        local_c12 = (ushort)local_fc4;
        local_c14 = (ushort)local_fc4;
        local_c16 = (ushort)local_fc4;
        local_c18 = (ushort)local_fc4;
        local_c1a = (ushort)local_fc4;
        local_c1c = (ushort)local_fc4;
        local_c1e = (ushort)local_fc4;
        local_c20 = (ushort)local_fc4;
        auVar65._0_16_ = vpinsrw_avx(ZEXT216((ushort)local_fc4),local_fc4 & 0xffff,1);
        auVar65._0_16_ = vpinsrw_avx(auVar65._0_16_,local_fc4 & 0xffff,2);
        auVar65._0_16_ = vpinsrw_avx(auVar65._0_16_,local_fc4 & 0xffff,3);
        auVar65._0_16_ = vpinsrw_avx(auVar65._0_16_,local_fc4 & 0xffff,4);
        auVar65._0_16_ = vpinsrw_avx(auVar65._0_16_,local_fc4 & 0xffff,5);
        auVar65._0_16_ = vpinsrw_avx(auVar65._0_16_,local_fc4 & 0xffff,6);
        auVar65._16_16_ = vpinsrw_avx(auVar65._0_16_,local_fc4 & 0xffff,7);
        auVar65._0_16_ = vpinsrw_avx(ZEXT216((ushort)local_fc4),local_fc4 & 0xffff,1);
        auVar65._0_16_ = vpinsrw_avx(auVar65._0_16_,local_fc4 & 0xffff,2);
        auVar65._0_16_ = vpinsrw_avx(auVar65._0_16_,local_fc4 & 0xffff,3);
        auVar65._0_16_ = vpinsrw_avx(auVar65._0_16_,local_fc4 & 0xffff,4);
        auVar65._0_16_ = vpinsrw_avx(auVar65._0_16_,local_fc4 & 0xffff,5);
        auVar65._0_16_ = vpinsrw_avx(auVar65._0_16_,local_fc4 & 0xffff,6);
        auVar65._0_16_ = vpinsrw_avx(auVar65._0_16_,local_fc4 & 0xffff,7);
        auVar65._0_16_ = ZEXT116(0) * auVar65._16_16_ + ZEXT116(1) * auVar65._0_16_;
        auVar65._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar65._16_16_;
        local_c40._16_8_ = auVar65._16_8_;
        local_c40._24_8_ = auVar65._24_8_;
        auVar49._16_8_ = local_c40._16_8_;
        auVar49._0_16_ = auVar65._0_16_;
        auVar49._24_8_ = local_c40._24_8_;
        auVar48._16_8_ = local_d00._16_8_;
        auVar48._0_16_ = auVar63._0_16_;
        auVar48._24_8_ = local_d00._24_8_;
        local_6c0 = vpand_avx2(auVar49,auVar48);
        local_6c4 = 1;
        local_1040 = vpsrlw_avx2(local_6c0,ZEXT416(1));
        local_c40 = auVar65;
        local_772 = uVar12;
        local_754 = uVar12;
        local_752 = local_774;
        local_750 = local_776;
        local_74e = local_778;
        local_74c = local_77a;
        local_74a = local_77c;
        local_748 = local_77e;
        local_746 = local_780;
        auVar55 = auVar63._0_16_;
        auVar56 = auVar63._16_16_;
      }
      else {
        local_d60 = (uint8_t  [8])HighbdEvenOddMaskx4[0]._0_8_;
        auStack_d58 = (uint8_t  [8])HighbdEvenOddMaskx4[0]._8_8_;
        auVar2._8_8_ = HighbdEvenOddMaskx4[0]._8_8_;
        auVar2._0_8_ = HighbdEvenOddMaskx4[0]._0_8_;
        local_fb0 = vpshufb_avx(*pauVar60,auVar2);
        local_fc0 = vpsrldq_avx(local_fb0,8);
        local_7a4 = uVar12 + 2;
        local_7a6 = uVar12 + 4;
        local_7a8 = uVar12 + 6;
        local_7aa = uVar12 + 8;
        local_7ac = uVar12 + 10;
        local_7ae = uVar12 + 0xc;
        local_7b0 = uVar12 + 0xe;
        auVar64._0_16_ = vpinsrw_avx(ZEXT216(uVar12),(uint)local_7a4,1);
        auVar64._0_16_ = vpinsrw_avx(auVar64._0_16_,(uint)local_7a6,2);
        auVar64._0_16_ = vpinsrw_avx(auVar64._0_16_,(uint)local_7a8,3);
        auVar64._0_16_ = vpinsrw_avx(auVar64._0_16_,(uint)local_7aa,4);
        auVar64._0_16_ = vpinsrw_avx(auVar64._0_16_,(uint)local_7ac,5);
        auVar64._0_16_ = vpinsrw_avx(auVar64._0_16_,(uint)local_7ae,6);
        local_7a0 = vpinsrw_avx(auVar64._0_16_,(uint)local_7b0,7);
        local_f90 = local_7a0._0_8_;
        uStack_f88 = local_7a0._8_8_;
        local_dc6 = (ushort)local_fc4;
        local_c82 = (ushort)local_fc4;
        local_c84 = (ushort)local_fc4;
        local_c86 = (ushort)local_fc4;
        local_c88 = (ushort)local_fc4;
        local_c8a = (ushort)local_fc4;
        local_c8c = (ushort)local_fc4;
        local_c8e = (ushort)local_fc4;
        local_c90 = (ushort)local_fc4;
        local_c92 = (ushort)local_fc4;
        local_c94 = (ushort)local_fc4;
        local_c96 = (ushort)local_fc4;
        local_c98 = (ushort)local_fc4;
        local_c9a = (ushort)local_fc4;
        local_c9c = (ushort)local_fc4;
        local_c9e = (ushort)local_fc4;
        local_ca0 = (ushort)local_fc4;
        auVar64._0_16_ = vpinsrw_avx(ZEXT216((ushort)local_fc4),local_fc4 & 0xffff,1);
        auVar64._0_16_ = vpinsrw_avx(auVar64._0_16_,local_fc4 & 0xffff,2);
        auVar64._0_16_ = vpinsrw_avx(auVar64._0_16_,local_fc4 & 0xffff,3);
        auVar64._0_16_ = vpinsrw_avx(auVar64._0_16_,local_fc4 & 0xffff,4);
        auVar64._0_16_ = vpinsrw_avx(auVar64._0_16_,local_fc4 & 0xffff,5);
        auVar64._0_16_ = vpinsrw_avx(auVar64._0_16_,local_fc4 & 0xffff,6);
        local_cc0 = vpinsrw_avx(auVar64._0_16_,local_fc4 & 0xffff,7);
        auVar64._0_16_ = vpinsrw_avx(ZEXT216((ushort)local_fc4),local_fc4 & 0xffff,1);
        auVar64._0_16_ = vpinsrw_avx(auVar64._0_16_,local_fc4 & 0xffff,2);
        auVar64._0_16_ = vpinsrw_avx(auVar64._0_16_,local_fc4 & 0xffff,3);
        auVar64._0_16_ = vpinsrw_avx(auVar64._0_16_,local_fc4 & 0xffff,4);
        auVar64._0_16_ = vpinsrw_avx(auVar64._0_16_,local_fc4 & 0xffff,5);
        auVar64._0_16_ = vpinsrw_avx(auVar64._0_16_,local_fc4 & 0xffff,6);
        auStack_cb0 = vpinsrw_avx(auVar64._0_16_,local_fc4 & 0xffff,7);
        local_680 = local_cc0._0_8_;
        uStack_678 = local_cc0._8_8_;
        uStack_670 = auStack_cb0._0_8_;
        uStack_668 = auStack_cb0._8_8_;
        auVar51._16_8_ = auStack_cb0._0_8_;
        auVar51._0_16_ = local_cc0;
        auVar51._24_8_ = auStack_cb0._8_8_;
        local_b20 = vpsllw_avx2(auVar51,ZEXT416(in_ECX));
        local_dc8 = 0x3f;
        local_c42 = 0x3f;
        local_c44 = 0x3f;
        local_c46 = 0x3f;
        local_c48 = 0x3f;
        local_c4a = 0x3f;
        local_c4c = 0x3f;
        local_c4e = 0x3f;
        local_c50 = 0x3f;
        local_c52 = 0x3f;
        local_c54 = 0x3f;
        local_c56 = 0x3f;
        local_c58 = 0x3f;
        local_c5a = 0x3f;
        local_c5c = 0x3f;
        local_c5e = 0x3f;
        local_c60 = 0x3f;
        auVar64._0_16_ = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
        auVar64._0_16_ = vpinsrw_avx(auVar64._0_16_,0x3f,2);
        auVar64._0_16_ = vpinsrw_avx(auVar64._0_16_,0x3f,3);
        auVar64._0_16_ = vpinsrw_avx(auVar64._0_16_,0x3f,4);
        auVar64._0_16_ = vpinsrw_avx(auVar64._0_16_,0x3f,5);
        auVar64._0_16_ = vpinsrw_avx(auVar64._0_16_,0x3f,6);
        auVar64._16_16_ = vpinsrw_avx(auVar64._0_16_,0x3f,7);
        auVar64._0_16_ = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
        auVar64._0_16_ = vpinsrw_avx(auVar64._0_16_,0x3f,2);
        auVar64._0_16_ = vpinsrw_avx(auVar64._0_16_,0x3f,3);
        auVar64._0_16_ = vpinsrw_avx(auVar64._0_16_,0x3f,4);
        auVar64._0_16_ = vpinsrw_avx(auVar64._0_16_,0x3f,5);
        auVar64._0_16_ = vpinsrw_avx(auVar64._0_16_,0x3f,6);
        auVar64._0_16_ = vpinsrw_avx(auVar64._0_16_,0x3f,7);
        auVar64._0_16_ = ZEXT116(0) * auVar64._16_16_ + ZEXT116(1) * auVar64._0_16_;
        auVar64._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar64._16_16_;
        local_c80._16_8_ = auVar64._16_8_;
        local_c80._24_8_ = auVar64._24_8_;
        auVar50._16_8_ = local_c80._16_8_;
        auVar50._0_16_ = auVar64._0_16_;
        auVar50._24_8_ = local_c80._24_8_;
        local_740 = vpand_avx2(local_b20,auVar50);
        local_744 = 1;
        local_1040 = vpsrlw_avx2(local_740,ZEXT416(1));
        local_d50 = *(undefined8 *)*pauVar60;
        uStack_d48 = *(undefined8 *)(*pauVar60 + 8);
        local_c80 = auVar64;
        local_7a2 = uVar12;
        local_790 = uVar12;
        local_78e = local_7a4;
        local_78c = local_7a6;
        local_78a = local_7a8;
        local_788 = local_7aa;
        local_786 = local_7ac;
        local_784 = local_7ae;
        local_782 = local_7b0;
      }
      auVar68 = ZEXT416(1);
      auStack_ed0._0_8_ = auVar68._0_8_;
      uVar17 = auStack_ed0._0_8_;
      auVar47._16_8_ = auStack_ed0._0_8_;
      auVar47._0_16_ = local_fc0;
      auVar47._24_8_ = 0;
      auVar46._16_8_ = auStack_ed0._0_8_;
      auVar46._0_16_ = local_fb0;
      auVar46._24_8_ = 0;
      auVar11 = vpsubw_avx2(auVar47,auVar46);
      local_644 = 5;
      auVar52._16_8_ = auStack_ed0._0_8_;
      auVar52._0_16_ = local_fb0;
      auVar52._24_8_ = 0;
      auVar10 = vpsllw_avx2(auVar52,ZEXT416(5));
      local_f00._0_8_ = auVar10._0_8_;
      uVar18 = local_f00._0_8_;
      local_f00._8_8_ = auVar10._8_8_;
      uVar19 = local_f00._8_8_;
      local_f00._16_8_ = auVar10._16_8_;
      uVar20 = local_f00._16_8_;
      local_f00._24_8_ = auVar10._24_8_;
      uVar21 = local_f00._24_8_;
      auVar45._16_8_ = auStack_d30._0_8_;
      auVar45._0_16_ = auVar4;
      auVar45._24_8_ = auStack_d30._8_8_;
      auVar10 = vpaddw_avx2(auVar10,auVar45);
      local_f40._0_8_ = auVar11._0_8_;
      uVar22 = local_f40._0_8_;
      local_f40._8_8_ = auVar11._8_8_;
      uVar23 = local_f40._8_8_;
      local_f40._16_8_ = auVar11._16_8_;
      uVar24 = local_f40._16_8_;
      local_f40._24_8_ = auVar11._24_8_;
      uVar25 = local_f40._24_8_;
      auVar9 = vpmullw_avx2(auVar11,local_1040);
      local_f00._0_8_ = auVar10._0_8_;
      uVar26 = local_f00._0_8_;
      local_f00._8_8_ = auVar10._8_8_;
      uVar27 = local_f00._8_8_;
      local_f00._16_8_ = auVar10._16_8_;
      uVar28 = local_f00._16_8_;
      local_f00._24_8_ = auVar10._24_8_;
      uVar29 = local_f00._24_8_;
      local_1000._0_8_ = auVar9._0_8_;
      uVar30 = local_1000._0_8_;
      local_1000._8_8_ = auVar9._8_8_;
      uVar31 = local_1000._8_8_;
      local_1000._16_8_ = auVar9._16_8_;
      uVar32 = local_1000._16_8_;
      local_1000._24_8_ = auVar9._24_8_;
      uVar33 = local_1000._24_8_;
      auVar8 = vpaddw_avx2(auVar10,auVar9);
      local_1020._0_8_ = auVar8._0_8_;
      uVar34 = local_1020._0_8_;
      local_1020._8_8_ = auVar8._8_8_;
      uVar35 = local_1020._8_8_;
      local_1020._16_8_ = auVar8._16_8_;
      uVar36 = local_1020._16_8_;
      local_1020._24_8_ = auVar8._24_8_;
      uVar37 = local_1020._24_8_;
      local_704 = 5;
      auVar8 = vpsrlw_avx2(auVar8,ZEXT416(5));
      local_1020._0_8_ = auVar8._0_8_;
      uVar13 = local_1020._0_8_;
      local_1020._8_8_ = auVar8._8_8_;
      uVar14 = local_1020._8_8_;
      local_1020._16_8_ = auVar8._16_8_;
      uVar38 = local_1020._16_8_;
      local_1020._24_8_ = auVar8._24_8_;
      uVar39 = local_1020._24_8_;
      auVar3._8_8_ = uStack_f88;
      auVar3._0_8_ = local_f90;
      auVar3 = vpcmpgtw_avx(auVar7,auVar3);
      local_fa0._0_8_ = auVar3._0_8_;
      uVar15 = local_fa0._0_8_;
      local_fa0._8_8_ = auVar3._8_8_;
      uVar16 = local_fa0._8_8_;
      auVar2 = vpblendvb_avx(auVar6,auVar8._0_16_,auVar3);
      *(undefined1 (*) [16])(local_10c0 + (long)local_fc8 * 2) = auVar2;
      local_fc4 = in_R8D + local_fc4;
      local_1050 = local_1020._0_8_;
      uStack_1048 = local_1020._8_8_;
      local_1020 = auVar8;
      local_1000 = auVar9;
      local_fa0 = auVar3;
      local_f40 = auVar11;
      local_f00 = auVar10;
      local_ee0 = local_fc0._0_8_;
      uStack_ed8 = local_fc0._8_8_;
      auStack_ed0 = auVar68;
      local_ec0 = local_fb0._0_8_;
      uStack_eb8 = local_fb0._8_8_;
      auStack_eb0 = auVar68;
      local_e60 = uVar30;
      uStack_e58 = uVar31;
      uStack_e50 = uVar32;
      uStack_e48 = uVar33;
      local_e40 = uVar26;
      uStack_e38 = uVar27;
      uStack_e30 = uVar28;
      uStack_e28 = uVar29;
      local_e20 = local_d40._0_8_;
      uStack_e18 = local_d40._8_8_;
      uStack_e10 = auStack_d30._0_8_;
      uStack_e08 = auStack_d30._8_8_;
      local_e00 = uVar18;
      uStack_df8 = uVar19;
      uStack_df0 = uVar20;
      uStack_de8 = uVar21;
      local_dc0 = uVar13;
      uStack_db8 = uVar14;
      uStack_db0 = uVar38;
      uStack_da8 = uVar39;
      local_d90 = local_fc0._0_8_;
      uStack_d88 = local_fc0._8_8_;
      local_d80 = local_fb0._0_8_;
      uStack_d78 = local_fb0._8_8_;
      local_bc0 = local_fb0._0_8_;
      uStack_bb8 = local_fb0._8_8_;
      uStack_bb0 = uVar17;
      uStack_ba8 = 0;
      local_ba0 = local_fc0._0_8_;
      uStack_b98 = local_fc0._8_8_;
      uStack_b90 = uVar17;
      uStack_b88 = 0;
      local_7c0 = pauVar61;
      local_7b8 = pauVar60;
      local_700 = uVar34;
      uStack_6f8 = uVar35;
      uStack_6f0 = uVar36;
      uStack_6e8 = uVar37;
      local_640 = local_fb0._0_8_;
      uStack_638 = local_fb0._8_8_;
      uStack_630 = uVar17;
      uStack_628 = 0;
      local_620 = local_1040._0_8_;
      uStack_618 = local_1040._8_8_;
      uStack_610 = local_1040._16_8_;
      uStack_608 = local_1040._24_8_;
      local_600 = uVar22;
      uStack_5f8 = uVar23;
      uStack_5f0 = uVar24;
      uStack_5e8 = uVar25;
      local_5e0 = local_f90;
      uStack_5d8 = uStack_f88;
      local_5d0 = local_be0._0_8_;
      uStack_5c8 = local_be0._8_8_;
      local_590 = uVar15;
      uStack_588 = uVar16;
      local_580 = uVar13;
      uStack_578 = uVar14;
      local_570 = local_c00._0_8_;
      lStack_568 = local_c00._8_8_;
    }
  }
  else {
    local_944 = 4;
    iVar57 = 6 - in_ECX;
    local_40 = 7 << (local_e7c & 0x1f);
    local_548 = 0x10;
    local_4a4 = 0x10;
    local_4a8 = 0x10;
    local_4ac = 0x10;
    local_4b0 = 0x10;
    local_4b4 = 0x10;
    local_4b8 = 0x10;
    local_4bc = 0x10;
    local_4c0 = 0x10;
    auVar2 = vpinsrd_avx(ZEXT416(0x10),0x10,1);
    auVar2 = vpinsrd_avx(auVar2,0x10,2);
    auVar2 = vpinsrd_avx(auVar2,0x10,3);
    auVar3 = vpinsrd_avx(ZEXT416(0x10),0x10,1);
    auVar3 = vpinsrd_avx(auVar3,0x10,2);
    auVar3 = vpinsrd_avx(auVar3,0x10,3);
    local_4e0._0_8_ = auVar2._0_8_;
    local_4e0._8_8_ = auVar2._8_8_;
    auStack_4d0._0_8_ = auVar3._0_8_;
    auStack_4d0._8_8_ = auVar3._8_8_;
    local_a00 = local_4e0._0_8_;
    uStack_9f8 = local_4e0._8_8_;
    uStack_9f0 = auStack_4d0._0_8_;
    uStack_9e8 = auStack_4d0._8_8_;
    uVar1 = *(ushort *)(in_RDX + (long)(int)local_40 * 2);
    uStack_908 = CONCAT26(uVar1,(undefined6)uStack_908);
    auVar4 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
    auVar4 = vpinsrw_avx(auVar4,(uint)uVar1,2);
    auVar4 = vpinsrw_avx(auVar4,(uint)uVar1,3);
    auVar4 = vpinsrw_avx(auVar4,(uint)uVar1,4);
    auVar4 = vpinsrw_avx(auVar4,(uint)uVar1,5);
    auVar4 = vpinsrw_avx(auVar4,(uint)uVar1,6);
    auVar68 = vpinsrw_avx(auVar4,(uint)uVar1,7);
    local_900._0_8_ = auVar68._0_8_;
    local_900._8_8_ = auVar68._8_8_;
    local_a30 = local_900._0_8_;
    lStack_a28 = local_900._8_8_;
    auVar4 = vpinsrd_avx(ZEXT416(local_40),local_40,1);
    auVar4 = vpinsrd_avx(auVar4,local_40,2);
    local_50 = vpinsrd_avx(auVar4,local_40,3);
    local_a40 = local_50._0_8_;
    uStack_a38 = local_50._8_8_;
    local_a64 = in_R8D;
    for (local_a68 = 0; auVar4 = local_d40, auVar5 = auStack_d30, auVar10 = local_d00,
        auVar6 = local_c00, auVar7 = local_be0, local_968 = local_40, local_964 = iVar57,
        local_950 = local_10c0, local_8f0 = uVar1, local_8ee = uVar1, local_8ec = uVar1,
        local_8ea = uVar1, local_8e8 = uVar1, local_8e6 = uVar1, local_8e4 = uVar1,
        local_8e2 = uVar1, local_544 = local_40, local_3c = local_40, local_38 = local_40,
        local_34 = local_40, local_a68 < 4; local_a68 = local_a68 + 1) {
      uVar58 = (int)local_a64 >> ((byte)iVar57 & 0x1f);
      local_af4 = uVar58;
      if ((int)local_40 <= (int)uVar58) {
        for (local_af8 = local_a68; local_af8 < 4; local_af8 = local_af8 + 1) {
          local_10c0[(long)local_af8 * 2] = local_900._0_8_;
          local_10c0[(long)local_af8 * 2 + 1] = local_900._8_8_;
        }
        break;
      }
      pauVar60 = (undefined1 (*) [16])(in_RDX + (long)(int)uVar58 * 2);
      uVar13 = *(undefined8 *)*pauVar60;
      uVar14 = *(undefined8 *)(*pauVar60 + 8);
      auVar10 = vpmovzxwd_avx2(*pauVar60);
      lVar62 = in_RDX + (long)(int)uVar58 * 2;
      pauVar61 = (undefined1 (*) [16])(lVar62 + 2);
      uVar15 = *(undefined8 *)*pauVar61;
      uVar16 = *(undefined8 *)(lVar62 + 10);
      _local_9c0 = vpmovzxwd_avx2(*pauVar61);
      if (in_ECX == 0) {
        local_32c = uVar58 + 1;
        local_330 = uVar58 + 2;
        local_334 = uVar58 + 3;
        auVar67._0_16_ = vpinsrd_avx(ZEXT416(uVar58),local_32c,1);
        auVar67._0_16_ = vpinsrd_avx(auVar67._0_16_,local_330,2);
        local_90 = vpinsrd_avx(auVar67._0_16_,local_334,3);
        local_a50 = local_90._0_8_;
        uStack_a48 = local_90._8_8_;
        local_54c = local_a64;
        local_464 = local_a64;
        local_468 = local_a64;
        local_46c = local_a64;
        local_470 = local_a64;
        local_474 = local_a64;
        local_478 = local_a64;
        local_47c = local_a64;
        local_480 = local_a64;
        auVar67._0_16_ = vpinsrd_avx(ZEXT416(local_a64),local_a64,1);
        auVar67._0_16_ = vpinsrd_avx(auVar67._0_16_,local_a64,2);
        local_4a0 = vpinsrd_avx(auVar67._0_16_,local_a64,3);
        auVar67._0_16_ = vpinsrd_avx(ZEXT416(local_a64),local_a64,1);
        auVar67._0_16_ = vpinsrd_avx(auVar67._0_16_,local_a64,2);
        auStack_490 = vpinsrd_avx(auVar67._0_16_,local_a64,3);
        local_550 = 0x3f;
        local_424 = 0x3f;
        local_428 = 0x3f;
        local_42c = 0x3f;
        local_430 = 0x3f;
        local_434 = 0x3f;
        local_438 = 0x3f;
        local_43c = 0x3f;
        local_440 = 0x3f;
        auVar67._0_16_ = vpinsrd_avx(ZEXT416(0x3f),0x3f,1);
        auVar67._0_16_ = vpinsrd_avx(auVar67._0_16_,0x3f,2);
        auVar67._16_16_ = vpinsrd_avx(auVar67._0_16_,0x3f,3);
        auVar67._0_16_ = vpinsrd_avx(ZEXT416(0x3f),0x3f,1);
        auVar67._0_16_ = vpinsrd_avx(auVar67._0_16_,0x3f,2);
        auVar67._0_16_ = vpinsrd_avx(auVar67._0_16_,0x3f,3);
        auVar67._0_16_ = ZEXT116(0) * auVar67._16_16_ + ZEXT116(1) * auVar67._0_16_;
        auVar67._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar67._16_16_;
        local_460._16_8_ = auVar67._16_8_;
        local_460._24_8_ = auVar67._24_8_;
        local_8c0 = local_4a0._0_8_;
        uStack_8b8 = local_4a0._8_8_;
        uStack_8b0 = auStack_490._0_8_;
        uStack_8a8 = auStack_490._8_8_;
        auVar9._16_8_ = auStack_490._0_8_;
        auVar9._0_16_ = local_4a0;
        auVar9._24_8_ = auStack_490._8_8_;
        auVar8._16_8_ = local_460._16_8_;
        auVar8._0_16_ = auVar67._0_16_;
        auVar8._24_8_ = local_460._24_8_;
        local_2a0 = vpand_avx2(auVar9,auVar8);
        local_2a4 = 1;
        local_ae0 = vpsrld_avx2(local_2a0,ZEXT416(1));
        local_9a0 = auVar10;
        local_460 = auVar67;
        local_328 = uVar58;
        local_80 = uVar58;
        local_7c = local_32c;
        local_78 = local_330;
        local_74 = local_334;
      }
      else {
        local_9a0._0_8_ = auVar10._0_8_;
        local_9a0._8_8_ = auVar10._8_8_;
        local_9a0._16_8_ = auVar10._16_8_;
        local_9a0._24_8_ = auVar10._24_8_;
        local_348 = 7;
        local_34c = 5;
        local_350 = 3;
        local_354 = 1;
        local_358 = 6;
        local_35c = 4;
        local_360 = 2;
        local_364 = 0;
        auVar66._0_16_ = vpinsrd_avx(ZEXT416(0),2,1);
        auVar66._0_16_ = vpinsrd_avx(auVar66._0_16_,4,2);
        local_3a0 = vpinsrd_avx(auVar66._0_16_,6,3);
        auVar66._0_16_ = vpinsrd_avx(ZEXT416(1),3,1);
        auVar66._0_16_ = vpinsrd_avx(auVar66._0_16_,5,2);
        auStack_390 = vpinsrd_avx(auVar66._0_16_,7,3);
        local_500 = local_9a0._0_8_;
        uStack_4f8 = local_9a0._8_8_;
        uStack_4f0 = local_9a0._16_8_;
        uStack_4e8 = local_9a0._24_8_;
        local_520 = local_3a0._0_8_;
        uStack_518 = local_3a0._8_8_;
        uStack_510 = auStack_390._0_8_;
        uStack_508 = auStack_390._8_8_;
        auVar11._16_8_ = auStack_390._0_8_;
        auVar11._0_16_ = local_3a0;
        auVar11._24_8_ = auStack_390._8_8_;
        local_9a0 = vpermd_avx2(auVar11,auVar10);
        uStack_908 = local_9a0._24_8_;
        uStack_910 = local_9a0._16_8_;
        local_9c0._8_8_ = uStack_918;
        local_9c0._0_8_ = local_920;
        stack0xfffffffffffff650 = auVar10._0_16_;
        local_33c = uVar58 + 2;
        local_340 = uVar58 + 4;
        local_344 = uVar58 + 6;
        auVar66._0_16_ = vpinsrd_avx(ZEXT416(uVar58),local_33c,1);
        auVar66._0_16_ = vpinsrd_avx(auVar66._0_16_,local_340,2);
        local_70 = vpinsrd_avx(auVar66._0_16_,local_344,3);
        local_a50 = local_70._0_8_;
        uStack_a48 = local_70._8_8_;
        local_554 = local_a64;
        local_3e4 = local_a64;
        local_3e8 = local_a64;
        local_3ec = local_a64;
        local_3f0 = local_a64;
        local_3f4 = local_a64;
        local_3f8 = local_a64;
        local_3fc = local_a64;
        local_400 = local_a64;
        auVar66._0_16_ = vpinsrd_avx(ZEXT416(local_a64),local_a64,1);
        auVar66._0_16_ = vpinsrd_avx(auVar66._0_16_,local_a64,2);
        local_420 = vpinsrd_avx(auVar66._0_16_,local_a64,3);
        auVar66._0_16_ = vpinsrd_avx(ZEXT416(local_a64),local_a64,1);
        auVar66._0_16_ = vpinsrd_avx(auVar66._0_16_,local_a64,2);
        auStack_410 = vpinsrd_avx(auVar66._0_16_,local_a64,3);
        local_260 = local_420._0_8_;
        uStack_258 = local_420._8_8_;
        uStack_250 = auStack_410._0_8_;
        uStack_248 = auStack_410._8_8_;
        auVar53._16_8_ = auStack_410._0_8_;
        auVar53._0_16_ = local_420;
        auVar53._24_8_ = auStack_410._8_8_;
        local_880 = vpslld_avx2(auVar53,ZEXT416(in_ECX));
        local_558 = 0x3f;
        local_3a4 = 0x3f;
        local_3a8 = 0x3f;
        local_3ac = 0x3f;
        local_3b0 = 0x3f;
        local_3b4 = 0x3f;
        local_3b8 = 0x3f;
        local_3bc = 0x3f;
        local_3c0 = 0x3f;
        auVar66._0_16_ = vpinsrd_avx(ZEXT416(0x3f),0x3f,1);
        auVar66._0_16_ = vpinsrd_avx(auVar66._0_16_,0x3f,2);
        auVar66._16_16_ = vpinsrd_avx(auVar66._0_16_,0x3f,3);
        auVar66._0_16_ = vpinsrd_avx(ZEXT416(0x3f),0x3f,1);
        auVar66._0_16_ = vpinsrd_avx(auVar66._0_16_,0x3f,2);
        auVar66._0_16_ = vpinsrd_avx(auVar66._0_16_,0x3f,3);
        auVar66._0_16_ = ZEXT116(0) * auVar66._16_16_ + ZEXT116(1) * auVar66._0_16_;
        auVar66._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar66._16_16_;
        local_3e0._16_8_ = auVar66._16_8_;
        local_3e0._24_8_ = auVar66._24_8_;
        auVar10._16_8_ = local_3e0._16_8_;
        auVar10._0_16_ = auVar66._0_16_;
        auVar10._24_8_ = local_3e0._24_8_;
        local_320 = vpand_avx2(local_880,auVar10);
        local_324 = 1;
        local_ae0 = vpsrld_avx2(local_320,ZEXT416(1));
        local_3e0 = auVar66;
        local_338 = uVar58;
        local_60 = uVar58;
        local_5c = local_33c;
        local_58 = local_340;
        local_54 = local_344;
      }
      auVar11 = vpsubd_avx2(_local_9c0,local_9a0);
      local_224 = 5;
      auVar10 = vpslld_avx2(local_9a0,ZEXT416(5));
      local_9e0._0_8_ = auVar10._0_8_;
      uVar23 = local_9e0._0_8_;
      local_9e0._8_8_ = auVar10._8_8_;
      uVar24 = local_9e0._8_8_;
      local_9e0._16_8_ = auVar10._16_8_;
      uVar25 = local_9e0._16_8_;
      local_9e0._24_8_ = auVar10._24_8_;
      uVar26 = local_9e0._24_8_;
      auVar54._16_8_ = auStack_4d0._0_8_;
      auVar54._0_16_ = auVar2;
      auVar54._24_8_ = auStack_4d0._8_8_;
      auVar10 = vpaddd_avx2(auVar10,auVar54);
      local_a20._0_8_ = auVar11._0_8_;
      uVar27 = local_a20._0_8_;
      local_a20._8_8_ = auVar11._8_8_;
      uVar28 = local_a20._8_8_;
      local_a20._16_8_ = auVar11._16_8_;
      uVar29 = local_a20._16_8_;
      local_a20._24_8_ = auVar11._24_8_;
      uVar30 = local_a20._24_8_;
      auVar9 = vpmulld_avx2(auVar11,local_ae0);
      local_9e0._0_8_ = auVar10._0_8_;
      uVar31 = local_9e0._0_8_;
      local_9e0._8_8_ = auVar10._8_8_;
      uVar32 = local_9e0._8_8_;
      local_9e0._16_8_ = auVar10._16_8_;
      uVar33 = local_9e0._16_8_;
      local_9e0._24_8_ = auVar10._24_8_;
      uVar34 = local_9e0._24_8_;
      local_aa0._0_8_ = auVar9._0_8_;
      uVar35 = local_aa0._0_8_;
      local_aa0._8_8_ = auVar9._8_8_;
      uVar36 = local_aa0._8_8_;
      local_aa0._16_8_ = auVar9._16_8_;
      uVar37 = local_aa0._16_8_;
      local_aa0._24_8_ = auVar9._24_8_;
      uVar38 = local_aa0._24_8_;
      auVar8 = vpaddd_avx2(auVar10,auVar9);
      local_ac0._0_8_ = auVar8._0_8_;
      uVar39 = local_ac0._0_8_;
      local_ac0._8_8_ = auVar8._8_8_;
      uVar40 = local_ac0._8_8_;
      local_ac0._16_8_ = auVar8._16_8_;
      uVar41 = local_ac0._16_8_;
      local_ac0._24_8_ = auVar8._24_8_;
      uVar42 = local_ac0._24_8_;
      local_2e4 = 5;
      auVar8 = vpsrld_avx2(auVar8,ZEXT416(5));
      local_ac0._0_8_ = auVar8._0_8_;
      uVar17 = local_ac0._0_8_;
      local_ac0._8_8_ = auVar8._8_8_;
      uVar18 = local_ac0._8_8_;
      local_ac0._16_8_ = auVar8._16_8_;
      uVar43 = local_ac0._16_8_;
      local_ac0._24_8_ = auVar8._24_8_;
      uVar44 = local_ac0._24_8_;
      auVar5 = vpackusdw_avx(auVar8._0_16_,auVar8._0_16_);
      local_c0 = local_50._0_8_;
      uStack_b8 = local_50._8_8_;
      auVar4._8_8_ = uStack_a48;
      auVar4._0_8_ = local_a50;
      auVar4 = vpcmpgtd_avx(local_50,auVar4);
      local_a60._0_8_ = auVar4._0_8_;
      local_a0 = local_a60._0_8_;
      local_a60._8_8_ = auVar4._8_8_;
      uStack_98 = local_a60._8_8_;
      local_b0 = local_a60._0_8_;
      uStack_a8 = local_a60._8_8_;
      auVar4 = vpackssdw_avx(auVar4,auVar4);
      local_af0._0_8_ = auVar5._0_8_;
      uVar19 = local_af0._0_8_;
      local_af0._8_8_ = auVar5._8_8_;
      uVar20 = local_af0._8_8_;
      local_a60._0_8_ = auVar4._0_8_;
      uVar21 = local_a60._0_8_;
      local_a60._8_8_ = auVar4._8_8_;
      uVar22 = local_a60._8_8_;
      auVar6 = vpblendvb_avx(auVar68,auVar5,auVar4);
      *(undefined1 (*) [16])(local_10c0 + (long)local_a68 * 2) = auVar6;
      local_a64 = in_R8D + local_a64;
      local_af0 = auVar5;
      local_ac0 = auVar8;
      local_aa0 = auVar9;
      local_a60 = auVar4;
      local_a20 = auVar11;
      local_9e0 = auVar10;
      local_940 = uVar17;
      uStack_938 = uVar18;
      uStack_930 = uVar43;
      uStack_928 = uVar44;
      local_7d0 = pauVar61;
      local_7c8 = pauVar60;
      local_5c0 = uVar21;
      uStack_5b8 = uVar22;
      local_5b0 = uVar19;
      uStack_5a8 = uVar20;
      local_5a0 = local_900._0_8_;
      lStack_598 = local_900._8_8_;
      local_540 = uVar15;
      uStack_538 = uVar16;
      local_530 = uVar13;
      uStack_528 = uVar14;
      local_2e0 = uVar39;
      uStack_2d8 = uVar40;
      uStack_2d0 = uVar41;
      uStack_2c8 = uVar42;
      local_220 = local_9a0._0_8_;
      uStack_218 = local_9a0._8_8_;
      uStack_210 = local_9a0._16_8_;
      uStack_208 = local_9a0._24_8_;
      local_200 = local_9a0._0_8_;
      uStack_1f8 = local_9a0._8_8_;
      uStack_1f0 = local_9a0._16_8_;
      uStack_1e8 = local_9a0._24_8_;
      local_1e0 = local_9c0._0_8_;
      uStack_1d8 = local_9c0._8_8_;
      uStack_1d0 = local_9c0._16_8_;
      uStack_1c8 = uStack_9a8;
      local_1c0 = uVar35;
      uStack_1b8 = uVar36;
      uStack_1b0 = uVar37;
      uStack_1a8 = uVar38;
      local_1a0 = uVar31;
      uStack_198 = uVar32;
      uStack_190 = uVar33;
      uStack_188 = uVar34;
      local_180 = local_4e0._0_8_;
      uStack_178 = local_4e0._8_8_;
      uStack_170 = auStack_4d0._0_8_;
      uStack_168 = auStack_4d0._8_8_;
      local_160 = uVar23;
      uStack_158 = uVar24;
      uStack_150 = uVar25;
      uStack_148 = uVar26;
      local_140 = local_ae0._0_8_;
      uStack_138 = local_ae0._8_8_;
      uStack_130 = local_ae0._16_8_;
      uStack_128 = local_ae0._24_8_;
      local_120 = uVar27;
      uStack_118 = uVar28;
      uStack_110 = uVar29;
      uStack_108 = uVar30;
      local_f0 = uVar17;
      uStack_e8 = uVar18;
      local_e0 = uVar17;
      uStack_d8 = uVar18;
      local_d0 = local_a50;
      uStack_c8 = uStack_a48;
    }
  }
  auStack_4d0 = auVar3;
  local_4e0 = auVar2;
  local_900 = auVar68;
  local_be0 = auVar7;
  local_c00 = auVar6;
  local_d00 = auVar10;
  auStack_d30 = auVar5;
  local_d40 = auVar4;
  local_1068 = in_RSI;
  local_1060 = in_RDI;
  local_f60 = auVar63._0_16_;
  auStack_f50 = auVar63._16_16_;
  local_b60 = auVar65._0_16_;
  auStack_b50 = auVar65._16_16_;
  local_b40 = auVar64._0_16_;
  auStack_b30 = auVar64._16_16_;
  local_8e0 = auVar67._0_16_;
  auStack_8d0 = auVar67._16_16_;
  local_8a0 = auVar66._0_16_;
  auStack_890 = auVar66._16_16_;
  local_b80 = auVar55;
  auStack_b70 = auVar56;
  highbd_transpose4x8_8x4_low_sse2
            ((__m128i *)local_10c0,(__m128i *)(local_10c0 + 2),(__m128i *)(local_10c0 + 4),
             (__m128i *)local_1090,&local_1100,&local_10f0,&local_10e0,&local_10d0);
  *local_1060 = local_1100[0];
  *(longlong *)((long)local_1060 + local_1068 * 2) = local_10f0[0];
  *(longlong *)((long)local_1060 + local_1068 * 4) = local_10e0[0];
  *(longlong *)((long)local_1060 + local_1068 * 6) = local_10d0[0];
  return;
}

Assistant:

static void highbd_dr_prediction_z3_4x4_avx2(uint16_t *dst, ptrdiff_t stride,
                                             const uint16_t *left,
                                             int upsample_left, int dy,
                                             int bd) {
  __m128i dstvec[4], d[4];
  if (bd < 12) {
    highbd_dr_prediction_z1_4xN_internal_avx2(4, dstvec, left, upsample_left,
                                              dy);
  } else {
    highbd_dr_prediction_32bit_z1_4xN_internal_avx2(4, dstvec, left,
                                                    upsample_left, dy);
  }
  highbd_transpose4x8_8x4_low_sse2(&dstvec[0], &dstvec[1], &dstvec[2],
                                   &dstvec[3], &d[0], &d[1], &d[2], &d[3]);
  _mm_storel_epi64((__m128i *)(dst + 0 * stride), d[0]);
  _mm_storel_epi64((__m128i *)(dst + 1 * stride), d[1]);
  _mm_storel_epi64((__m128i *)(dst + 2 * stride), d[2]);
  _mm_storel_epi64((__m128i *)(dst + 3 * stride), d[3]);
  return;
}